

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001a5020 = 0x2d2d2d2d2d2d2d;
    uRam00000000001a5027._0_1_ = '-';
    uRam00000000001a5027._1_1_ = '-';
    uRam00000000001a5027._2_1_ = '-';
    uRam00000000001a5027._3_1_ = '-';
    uRam00000000001a5027._4_1_ = '-';
    uRam00000000001a5027._5_1_ = '-';
    uRam00000000001a5027._6_1_ = '-';
    uRam00000000001a5027._7_1_ = '-';
    DAT_001a5010 = '-';
    DAT_001a5010_1._0_1_ = '-';
    DAT_001a5010_1._1_1_ = '-';
    DAT_001a5010_1._2_1_ = '-';
    DAT_001a5010_1._3_1_ = '-';
    DAT_001a5010_1._4_1_ = '-';
    DAT_001a5010_1._5_1_ = '-';
    DAT_001a5010_1._6_1_ = '-';
    uRam00000000001a5018 = 0x2d2d2d2d2d2d2d;
    DAT_001a501f = 0x2d;
    DAT_001a5000 = '-';
    DAT_001a5000_1._0_1_ = '-';
    DAT_001a5000_1._1_1_ = '-';
    DAT_001a5000_1._2_1_ = '-';
    DAT_001a5000_1._3_1_ = '-';
    DAT_001a5000_1._4_1_ = '-';
    DAT_001a5000_1._5_1_ = '-';
    DAT_001a5000_1._6_1_ = '-';
    uRam00000000001a5008._0_1_ = '-';
    uRam00000000001a5008._1_1_ = '-';
    uRam00000000001a5008._2_1_ = '-';
    uRam00000000001a5008._3_1_ = '-';
    uRam00000000001a5008._4_1_ = '-';
    uRam00000000001a5008._5_1_ = '-';
    uRam00000000001a5008._6_1_ = '-';
    uRam00000000001a5008._7_1_ = '-';
    DAT_001a4ff0 = '-';
    DAT_001a4ff0_1._0_1_ = '-';
    DAT_001a4ff0_1._1_1_ = '-';
    DAT_001a4ff0_1._2_1_ = '-';
    DAT_001a4ff0_1._3_1_ = '-';
    DAT_001a4ff0_1._4_1_ = '-';
    DAT_001a4ff0_1._5_1_ = '-';
    DAT_001a4ff0_1._6_1_ = '-';
    uRam00000000001a4ff8._0_1_ = '-';
    uRam00000000001a4ff8._1_1_ = '-';
    uRam00000000001a4ff8._2_1_ = '-';
    uRam00000000001a4ff8._3_1_ = '-';
    uRam00000000001a4ff8._4_1_ = '-';
    uRam00000000001a4ff8._5_1_ = '-';
    uRam00000000001a4ff8._6_1_ = '-';
    uRam00000000001a4ff8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001a4fe8._0_1_ = '-';
    uRam00000000001a4fe8._1_1_ = '-';
    uRam00000000001a4fe8._2_1_ = '-';
    uRam00000000001a4fe8._3_1_ = '-';
    uRam00000000001a4fe8._4_1_ = '-';
    uRam00000000001a4fe8._5_1_ = '-';
    uRam00000000001a4fe8._6_1_ = '-';
    uRam00000000001a4fe8._7_1_ = '-';
    DAT_001a502f = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}